

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_fma::forward(Padding_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  __m256 afVar2;
  int *piVar3;
  void *pvVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined8 uVar17;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  int iVar32;
  ulong uVar33;
  sbyte sVar34;
  int iVar35;
  int iVar36;
  float *pfVar37;
  uint uVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  int iVar43;
  int x_2;
  int iVar44;
  long lVar45;
  undefined1 auVar46 [8];
  int x;
  float *pfVar47;
  __m256 *pafVar48;
  undefined1 (*pauVar49) [16];
  uint uVar50;
  __m256 *pafVar51;
  undefined1 (*pauVar52) [16];
  int z;
  long lVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  Mat m_1;
  __m256 pad_value;
  __m256 pad_value_1;
  Mat local_160;
  ulong local_108;
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  float fStack_e8;
  float fStack_e4;
  Allocator *local_e0;
  int local_d8;
  undefined1 local_d4 [16];
  ulong local_c0;
  ulong local_b8;
  int local_ac;
  ulong local_a8;
  __m256 local_a0;
  __m256 local_80 [2];
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined3 uVar20;
  undefined1 uVar21;
  undefined2 uVar22;
  undefined1 uVar23;
  
  auVar6._0_4_ = (this->super_Padding).top;
  auVar6._4_4_ = (this->super_Padding).bottom;
  auVar6._8_4_ = (this->super_Padding).left;
  auVar6._12_4_ = (this->super_Padding).right;
  uVar50 = (this->super_Padding).front;
  iVar32 = (this->super_Padding).behind;
  if ((iVar32 == 0 && uVar50 == 0) && auVar6 == (undefined1  [16])0x0) {
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->c = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar32 = bottom_blob->w;
      iVar36 = bottom_blob->h;
      iVar40 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar32;
      top_blob->h = iVar36;
      top_blob->d = iVar40;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  fStack_e8 = (float)bottom_blob->elempack;
  uStack_f0 = bottom_blob->elemsize;
  if (fStack_e8 == 0.0) {
    auVar59._0_4_ = bottom_blob->w;
    auVar59._4_4_ = bottom_blob->h;
    auVar59._8_4_ = bottom_blob->d;
    auVar59._12_4_ = bottom_blob->c;
    local_d8 = bottom_blob->dims;
  }
  else {
    if (((int)uStack_f0 * 8) / (int)fStack_e8 == 8) {
      iVar32 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar32;
    }
    auVar59._0_4_ = bottom_blob->w;
    auVar59._4_4_ = bottom_blob->h;
    auVar59._8_4_ = bottom_blob->d;
    auVar59._12_4_ = bottom_blob->c;
    local_d8 = bottom_blob->dims;
    auVar60 = vpshufd_avx(auVar59,0x55);
    auVar58 = vpshufd_avx(auVar6,0x55);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar8 = vpshufd_avx(auVar6,0xff);
    uVar54 = (ulong)(uint)auVar59._12_4_;
    if (fStack_e8 == 5.60519e-45) {
      switch(local_d8) {
      case 1:
        local_d8 = 1;
        if ((((auVar6 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
            (uVar50 = auVar6._8_4_ + auVar59._0_4_ * 4 + auVar6._12_4_, (uVar50 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,(int)uVar50 >> 2,
                      (uStack_f0 >> 2) <<
                      ((auVar6 & (undefined1  [16])0x300000000) == (undefined1  [16])0x0) * '\x02',4
                      ,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_100._4_4_ = (this->super_Padding).value;
            local_100._0_4_ = local_100._4_4_;
            uStack_f8 = (int *)CONCAT44(local_100._4_4_,local_100._4_4_);
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,0,0,(this->super_Padding).left / 4,
                       (this->super_Padding).right / 4,(__m128 *)local_100);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        local_d8 = 2;
        if ((((auVar6 & (undefined1  [16])0x3) == (undefined1  [16])0x0) &&
            (uVar50 = auVar6._0_4_ + auVar59._4_4_ * 4 + auVar6._4_4_, (uVar50 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          auVar59 = vpaddd_avx(auVar7,auVar59);
          auVar59 = vpaddd_avx(auVar59,auVar8);
          Mat::create(top_blob,auVar59._0_4_,(int)uVar50 >> 2,
                      (uStack_f0 >> 2) <<
                      ((auVar6 & (undefined1  [16])0x300000000) == (undefined1  [16])0x0) * '\x02',4
                      ,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_100._4_4_ = (this->super_Padding).value;
            local_100._0_4_ = local_100._4_4_;
            uStack_f8 = (int *)CONCAT44(local_100._4_4_,local_100._4_4_);
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,(this->super_Padding).top / 4,
                       (this->super_Padding).bottom / 4,(this->super_Padding).left,
                       (this->super_Padding).right,(__m128 *)local_100);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar38 = uVar50 + auVar59._12_4_ * 4 + iVar32;
        sVar34 = ((uVar38 & 3) == 0) * '\x02';
        local_d8 = 3;
        if ((uVar38 & 7) == 0) {
          sVar34 = 3;
        }
        local_108 = uVar54;
        if ((((uVar50 & 3) == 0) && ((uVar38 & 7) == 4)) &&
           ((uVar38 == auVar59._12_4_ * 4 || ((this->super_Padding).type == 0)))) {
          auVar59 = vpaddd_avx(auVar7,auVar59);
          auVar59 = vpaddd_avx(auVar59,auVar8);
          auVar6 = vpaddd_avx(auVar6,auVar60);
          auVar6 = vpaddd_avx(auVar6,auVar58);
          uVar38 = (int)uVar38 >> 2;
          Mat::create(top_blob,auVar59._0_4_,auVar6._0_4_,uVar38,(uStack_f0 >> 2) << sVar34,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            uVar54 = (long)(this->super_Padding).front / -4;
            if ((int)uVar38 < 1) {
              uVar38 = 0;
            }
            uVar56 = (ulong)uVar38;
            local_ac = (int)uVar54;
            uVar54 = uVar54 & 0xffffffff;
            local_a8 = uVar56;
            for (local_b8 = 0; iVar32 = (int)uVar54, local_b8 != uVar56; local_b8 = local_b8 + 1) {
              uVar26 = top_blob->w;
              uVar27 = top_blob->h;
              local_d4._4_4_ = uVar27;
              local_d4._0_4_ = uVar26;
              uStack_f0 = top_blob->elemsize;
              pauVar49 = (undefined1 (*) [16])
                         (top_blob->cstep * local_b8 * uStack_f0 + (long)top_blob->data);
              fStack_e8 = (float)top_blob->elempack;
              local_e0 = top_blob->allocator;
              uStack_f8 = (int *)0x0;
              local_d4._8_4_ = 1;
              local_d4._12_4_ = top_blob->d;
              uVar33 = (long)top_blob->h * (long)top_blob->w;
              local_d8 = top_blob->dims + -1;
              local_c0 = (uStack_f0 * uVar33 + 0xf & 0xfffffffffffffff0) / uStack_f0;
              if (top_blob->dims == 4) {
                local_c0 = uVar33;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                auVar58._4_4_ = fVar1;
                auVar58._0_4_ = fVar1;
                auVar58._8_4_ = fVar1;
                auVar58._12_4_ = fVar1;
              }
              else {
                auVar58 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + local_b8 * 0x10)
                ;
              }
              local_80[0][0] = (float)auVar58._0_4_;
              local_80[0][1] = (float)auVar58._4_4_;
              local_80[0][2] = (float)auVar58._8_4_;
              local_80[0][3] = (float)auVar58._12_4_;
              uVar50 = local_ac + (int)local_b8;
              if ((int)uVar50 < 0 || (int)local_108 <= (int)uVar50) {
                iVar36 = top_blob->d * (int)local_c0;
                if (iVar36 < 1) {
                  iVar36 = 0;
                }
                while (bVar57 = iVar36 != 0, iVar36 = iVar36 + -1, bVar57) {
                  *pauVar49 = auVar58;
                  pauVar49 = pauVar49 + 1;
                }
              }
              else {
                local_a0[0] = (float)(int)uVar54;
                local_a0[1] = (float)(int)(uVar54 >> 0x20);
                local_160.w = bottom_blob->w;
                local_160.h = bottom_blob->h;
                local_160.c = bottom_blob->d;
                pvVar4 = bottom_blob->data;
                uVar54 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                pauVar52 = (undefined1 (*) [16])(uVar50 * sVar5 * uVar54 + (long)pvVar4);
                local_160.allocator = bottom_blob->allocator;
                local_160.refcount = (int *)0x0;
                local_160.elempack = bottom_blob->elempack;
                local_160.d = 1;
                local_160.dims = bottom_blob->dims + -1;
                local_160.cstep =
                     (uVar54 * (long)local_160.h * (long)local_160.w + 0xf & 0xfffffffffffffff0) /
                     uVar54;
                if (bottom_blob->dims == 4) {
                  local_160.cstep = (long)local_160.h * (long)local_160.w;
                }
                iVar32 = (this->super_Padding).type;
                local_160.data = pauVar52;
                local_160.elemsize = uVar54;
                local_100 = (undefined1  [8])pauVar49;
                if (iVar32 == 0) {
                  padding_constant_pack4_sse
                            (&local_160,(Mat *)local_100,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,(__m128 *)local_80);
                  iVar32 = (this->super_Padding).type;
                }
                uVar56 = local_a8;
                if (iVar32 == 1) {
                  iVar32 = (this->super_Padding).left;
                  iVar40 = 0;
                  iVar36 = 0;
                  if (iVar32 < 1) {
                    iVar32 = iVar36;
                  }
                  iVar35 = (this->super_Padding).right;
                  if (iVar35 < 1) {
                    iVar35 = iVar36;
                  }
                  iVar43 = (this->super_Padding).top;
                  if (iVar43 < 1) {
                    iVar43 = iVar36;
                  }
                  iVar36 = (this->super_Padding).bottom;
                  for (; iVar40 != iVar43; iVar40 = iVar40 + 1) {
                    auVar6 = *pauVar52;
                    iVar44 = iVar32;
                    while (bVar57 = iVar44 != 0, iVar44 = iVar44 + -1, bVar57) {
                      *pauVar49 = auVar6;
                      pauVar49 = pauVar49 + 1;
                    }
                    lVar45 = 0;
                    for (iVar44 = 0; iVar44 < local_160.w; iVar44 = iVar44 + 1) {
                      auVar6 = *(undefined1 (*) [16])
                                ((long)pvVar4 + lVar45 + sVar5 * uVar54 * local_a0._0_8_);
                      *(undefined1 (*) [16])(*pauVar49 + lVar45) = auVar6;
                      lVar45 = lVar45 + 0x10;
                    }
                    pauVar49 = (undefined1 (*) [16])(*pauVar49 + lVar45);
                    iVar44 = iVar35;
                    while (bVar57 = iVar44 != 0, iVar44 = iVar44 + -1, bVar57) {
                      *pauVar49 = auVar6;
                      pauVar49 = pauVar49 + 1;
                    }
                  }
                  for (iVar40 = 0; iVar40 < local_160.h; iVar40 = iVar40 + 1) {
                    auVar6 = *pauVar52;
                    iVar43 = iVar32;
                    while (bVar57 = iVar43 != 0, iVar43 = iVar43 + -1, bVar57) {
                      *pauVar49 = auVar6;
                      pauVar49 = pauVar49 + 1;
                    }
                    for (iVar43 = 0; iVar44 = iVar35, iVar43 < local_160.w; iVar43 = iVar43 + 1) {
                      auVar6 = *pauVar52;
                      *pauVar49 = auVar6;
                      pauVar52 = pauVar52 + 1;
                      pauVar49 = pauVar49 + 1;
                    }
                    while (iVar44 != 0) {
                      *pauVar49 = auVar6;
                      pauVar49 = pauVar49 + 1;
                      iVar44 = iVar44 + -1;
                    }
                  }
                  pauVar52 = (undefined1 (*) [16])((long)pauVar52 + (long)(local_160.w << 2) * -4);
                  iVar40 = 0;
                  if (iVar36 < 1) {
                    iVar36 = iVar40;
                  }
                  for (; iVar40 != iVar36; iVar40 = iVar40 + 1) {
                    auVar6 = *pauVar52;
                    iVar43 = iVar32;
                    while (bVar57 = iVar43 != 0, iVar43 = iVar43 + -1, bVar57) {
                      *pauVar49 = auVar6;
                      pauVar49 = pauVar49 + 1;
                    }
                    lVar45 = 0;
                    for (iVar43 = 0; iVar43 < local_160.w; iVar43 = iVar43 + 1) {
                      auVar6 = *(undefined1 (*) [16])(*pauVar52 + lVar45);
                      *(undefined1 (*) [16])(*pauVar49 + lVar45) = auVar6;
                      lVar45 = lVar45 + 0x10;
                    }
                    pauVar49 = (undefined1 (*) [16])(*pauVar49 + lVar45);
                    iVar43 = iVar35;
                    while (bVar57 = iVar43 != 0, iVar43 = iVar43 + -1, bVar57) {
                      *pauVar49 = auVar6;
                      pauVar49 = pauVar49 + 1;
                    }
                  }
                  iVar32 = (this->super_Padding).type;
                }
                if (iVar32 == 2) {
                  iVar32 = (this->super_Padding).top;
                  uVar50 = (this->super_Padding).left;
                  pauVar49 = (undefined1 (*) [16])
                             ((undefined1 *)local_160.data + (long)(local_160.w * iVar32 * 4) * 4);
                  uVar33 = 0;
                  uVar54 = 0;
                  if (0 < (int)uVar50) {
                    uVar54 = (ulong)uVar50;
                  }
                  uVar38 = (this->super_Padding).right;
                  uVar42 = (ulong)uVar38;
                  if ((int)uVar38 < 1) {
                    uVar42 = uVar33;
                  }
                  iVar36 = (this->super_Padding).bottom;
                  if (iVar32 < 1) {
                    iVar32 = 0;
                  }
                  lVar45 = uVar54 * 0x10;
                  lVar39 = uVar42 * 0x10;
                  auVar46 = local_100;
                  while( true ) {
                    if ((int)uVar33 == iVar32) break;
                    lVar53 = 0;
                    for (lVar41 = 0; lVar45 + lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*(undefined1 (*) [16])auVar46 + lVar53) =
                           *(undefined1 (*) [16])(pauVar49[(int)uVar50] + lVar41);
                      lVar53 = lVar53 + 0x10;
                    }
                    auVar46 = (undefined1  [8])((long)auVar46 - lVar41);
                    lVar41 = -0x20;
                    pauVar52 = pauVar49;
                    for (iVar40 = 0; iVar40 < local_160.w; iVar40 = iVar40 + 1) {
                      *(undefined1 (*) [16])auVar46 = *pauVar52;
                      pauVar52 = pauVar52 + 1;
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x10);
                    }
                    for (; lVar39 + lVar41 != -0x20; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])auVar46 = *(undefined1 (*) [16])(*pauVar52 + lVar41);
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x10);
                    }
                    pauVar49 = pauVar49 + -(long)local_160.w;
                    uVar33 = (ulong)((int)uVar33 + 1);
                  }
                  for (iVar32 = 0; iVar32 < local_160.h; iVar32 = iVar32 + 1) {
                    lVar53 = 0;
                    for (lVar41 = 0; lVar45 + lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*(undefined1 (*) [16])auVar46 + lVar53) =
                           *(undefined1 (*) [16])(pauVar49[(int)uVar50] + lVar41);
                      lVar53 = lVar53 + 0x10;
                    }
                    auVar46 = (undefined1  [8])((long)auVar46 - lVar41);
                    for (iVar40 = 0; lVar41 = -0x20, iVar40 < local_160.w; iVar40 = iVar40 + 1) {
                      *(undefined1 (*) [16])auVar46 = *pauVar49;
                      pauVar49 = pauVar49 + 1;
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x10);
                    }
                    for (; lVar39 + lVar41 != -0x20; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])auVar46 = *(undefined1 (*) [16])(*pauVar49 + lVar41);
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x10);
                    }
                  }
                  pauVar49 = pauVar49 + (long)local_160.w * -2;
                  iVar32 = 0;
                  if (iVar36 < 1) {
                    iVar36 = iVar32;
                  }
                  for (; iVar32 != iVar36; iVar32 = iVar32 + 1) {
                    lVar53 = 0;
                    for (lVar41 = 0; lVar45 + lVar41 != 0; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])(*(undefined1 (*) [16])auVar46 + lVar53) =
                           *(undefined1 (*) [16])(pauVar49[(int)uVar50] + lVar41);
                      lVar53 = lVar53 + 0x10;
                    }
                    auVar46 = (undefined1  [8])((long)auVar46 - lVar41);
                    pauVar52 = pauVar49;
                    for (iVar40 = 0; lVar41 = -0x20, iVar40 < local_160.w; iVar40 = iVar40 + 1) {
                      *(undefined1 (*) [16])auVar46 = *pauVar52;
                      pauVar52 = pauVar52 + 1;
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x10);
                    }
                    for (; lVar39 + lVar41 != -0x20; lVar41 = lVar41 + -0x10) {
                      *(undefined1 (*) [16])auVar46 = *(undefined1 (*) [16])(*pauVar52 + lVar41);
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x10);
                    }
                    pauVar49 = pauVar49 + -(long)local_160.w;
                  }
                }
                iVar32 = local_a0[0];
                if (local_160.refcount != (int *)0x0) {
                  LOCK();
                  *local_160.refcount = *local_160.refcount + -1;
                  UNLOCK();
                  if (*local_160.refcount == 0) {
                    if (local_160.allocator == (Allocator *)0x0) {
                      free(local_160.data);
                    }
                    else {
                      (*(local_160.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (uStack_f8 != (int *)0x0) {
                  LOCK();
                  *uStack_f8 = *uStack_f8 + -1;
                  UNLOCK();
                  if (*uStack_f8 == 0) {
                    if (local_e0 == (Allocator *)0x0) {
                      free((void *)local_100);
                    }
                    else {
                      (*local_e0->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              uVar54 = (ulong)(iVar32 + 1);
            }
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        if ((this->super_Padding).type == 0) {
          uVar50 = uVar50 + iVar32 + auVar59._8_4_;
          auVar6 = vpaddd_avx(auVar6,auVar60);
          auVar6 = vpaddd_avx(auVar6,auVar58);
          auVar60 = vpaddd_avx(auVar7,auVar59);
          auVar60 = vpaddd_avx(auVar60,auVar8);
          Mat::create(top_blob,auVar60._0_4_,auVar6._0_4_,uVar50,auVar59._12_4_,uStack_f0,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar50 < 1) {
              uVar50 = 0;
            }
            if ((int)auVar59._12_4_ < 1) {
              uVar54 = 0;
            }
            local_108 = uVar54;
            for (uVar56 = 0; uVar56 != local_108; uVar56 = uVar56 + 1) {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                auVar60._4_4_ = fVar1;
                auVar60._0_4_ = fVar1;
                auVar60._8_4_ = fVar1;
                auVar60._12_4_ = fVar1;
              }
              else {
                auVar60 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar56 * 0x10);
              }
              auVar61 = ZEXT1664(auVar60);
              local_80[0][0] = (float)auVar60._0_4_;
              local_80[0][1] = (float)auVar60._4_4_;
              local_80[0][2] = (float)auVar60._8_4_;
              local_80[0][3] = (float)auVar60._12_4_;
              local_a0[0] = (float)auVar60._0_4_;
              local_a0[1] = (float)auVar60._4_4_;
              local_a0[2] = (float)auVar60._8_4_;
              local_a0[3] = (float)auVar60._12_4_;
              for (uVar54 = 0; uVar54 != uVar50; uVar54 = uVar54 + 1) {
                uVar30 = top_blob->w;
                uVar31 = top_blob->h;
                local_d4._4_4_ = uVar31;
                local_d4._0_4_ = uVar30;
                uStack_f0 = top_blob->elemsize;
                fStack_e8 = (float)top_blob->elempack;
                local_c0 = (long)top_blob->h * (long)top_blob->w;
                local_100 = (undefined1  [8])
                            ((long)top_blob->data +
                            uVar54 * uStack_f0 * local_c0 + top_blob->cstep * uVar56 * uStack_f0);
                local_e0 = top_blob->allocator;
                uStack_f8 = (int *)0x0;
                local_d8 = 2;
                local_d4._8_8_ = 0x100000001;
                uVar38 = (int)uVar54 - (this->super_Padding).front;
                if ((int)uVar38 < 0 || (int)auVar59._8_4_ <= (int)uVar38) {
                  uVar33 = local_c0 & 0xffffffff;
                  if ((int)local_c0 < 1) {
                    uVar33 = 0;
                  }
                  while (iVar32 = (int)uVar33, uVar33 = (ulong)(iVar32 - 1), iVar32 != 0) {
                    *(undefined1 (*) [16])local_100 = auVar61._0_16_;
                    local_100 = (undefined1  [8])((long)local_100 + 0x10);
                  }
                }
                else {
                  local_160.h = bottom_blob->h;
                  local_160.elemsize = bottom_blob->elemsize;
                  local_160.allocator = bottom_blob->allocator;
                  local_160.cstep = (long)local_160.h * (long)bottom_blob->w;
                  local_160.data =
                       (void *)((long)bottom_blob->data +
                               uVar38 * local_160.elemsize * local_160.cstep +
                               bottom_blob->cstep * uVar56 * local_160.elemsize);
                  local_160.refcount = (int *)0x0;
                  local_160.elempack = bottom_blob->elempack;
                  local_160.w = bottom_blob->w;
                  local_160.dims = 2;
                  local_160.d = 1;
                  local_160.c = 1;
                  padding_constant_pack4_sse
                            (&local_160,(Mat *)local_100,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,(__m128 *)local_80);
                  auVar61 = ZEXT1664(local_a0._0_16_);
                }
              }
            }
            return 0;
          }
          return -100;
        }
LAB_003c0f17:
        local_d8 = 4;
      }
    }
    else if (fStack_e8 == 1.12104e-44) {
      switch(local_d8) {
      case 1:
        auVar60 = vphaddd_avx(auVar6,auVar6);
        if (((auVar6._8_4_ | auVar60._4_4_) & 7) == 0 && (this->super_Padding).type == 0) {
          Mat::create(top_blob,(int)(auVar60._4_4_ + auVar59._0_4_ * 8) / 8,
                      uStack_f0 & 0xfffffffffffffff8,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            fStack_e8 = (this->super_Padding).value;
            local_100._4_4_ = fStack_e8;
            local_100._0_4_ = fStack_e8;
            uStack_f8 = (int *)CONCAT44(fStack_e8,fStack_e8);
            uStack_f0 = CONCAT44(fStack_e8,fStack_e8);
            fStack_e4 = fStack_e8;
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,0,0,(this->super_Padding).left / 8,
                       (this->super_Padding).right / 8,(__m256 *)local_100);
            return 0;
          }
          return -100;
        }
        local_d8 = 1;
        break;
      case 2:
        uVar50 = auVar6._4_4_ + auVar6._0_4_ + auVar59._4_4_ * 8;
        if (((auVar6._0_4_ | uVar50) & 7) == 0 && (this->super_Padding).type == 0) {
          auVar6 = vpaddd_avx(auVar7,auVar59);
          auVar6 = vpaddd_avx(auVar6,auVar8);
          Mat::create(top_blob,auVar6._0_4_,(int)uVar50 / 8,uStack_f0 & 0xfffffffffffffff8,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            fStack_e8 = (this->super_Padding).value;
            local_100._4_4_ = fStack_e8;
            local_100._0_4_ = fStack_e8;
            uStack_f8 = (int *)CONCAT44(fStack_e8,fStack_e8);
            uStack_f0 = CONCAT44(fStack_e8,fStack_e8);
            fStack_e4 = fStack_e8;
            padding_constant_pack8_avx
                      (bottom_blob,top_blob,(this->super_Padding).top / 8,
                       (this->super_Padding).bottom / 8,(this->super_Padding).left,
                       (this->super_Padding).right,(__m256 *)local_100);
            return 0;
          }
          return -100;
        }
        local_d8 = 2;
        break;
      case 3:
        local_d8 = 3;
        uVar38 = uVar50 + auVar59._12_4_ * 8 + iVar32;
        sVar34 = ((uVar38 & 3) == 0) * '\x02';
        if ((uVar38 & 7) == 0) {
          sVar34 = 3;
        }
        if ((((uVar50 | uVar38) & 7) == 0) &&
           ((uVar38 == auVar59._12_4_ * 8 || (local_108 = uVar54, (this->super_Padding).type == 0)))
           ) {
          auVar59 = vpaddd_avx(auVar7,auVar59);
          auVar59 = vpaddd_avx(auVar59,auVar8);
          auVar6 = vpaddd_avx(auVar6,auVar60);
          auVar6 = vpaddd_avx(auVar6,auVar58);
          iVar32 = (int)((long)(int)uVar38 / 8);
          local_108 = uVar54;
          Mat::create(top_blob,auVar59._0_4_,auVar6._0_4_,iVar32,(uStack_f0 >> 3) << sVar34,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            uVar54 = (long)(this->super_Padding).front / -8;
            uVar56 = (long)(int)uVar38 / 8 & 0xffffffff;
            if (iVar32 < 1) {
              uVar56 = 0;
            }
            local_ac = (int)uVar54;
            uVar54 = uVar54 & 0xffffffff;
            local_a8 = uVar56;
            for (local_b8 = 0; iVar32 = (int)uVar54, local_b8 != uVar56; local_b8 = local_b8 + 1) {
              uVar24 = top_blob->w;
              uVar25 = top_blob->h;
              local_d4._4_4_ = uVar25;
              local_d4._0_4_ = uVar24;
              uStack_f0 = top_blob->elemsize;
              pafVar48 = (__m256 *)(top_blob->cstep * local_b8 * uStack_f0 + (long)top_blob->data);
              fStack_e8 = (float)top_blob->elempack;
              local_e0 = top_blob->allocator;
              uStack_f8 = (int *)0x0;
              local_d4._8_4_ = 1;
              local_d4._12_4_ = top_blob->d;
              uVar33 = (long)top_blob->h * (long)top_blob->w;
              local_d8 = top_blob->dims + -1;
              local_c0 = (uStack_f0 * uVar33 + 0xf & 0xfffffffffffffff0) / uStack_f0;
              if (top_blob->dims == 4) {
                local_c0 = uVar33;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                local_80[0][1] = fVar1;
                local_80[0][0] = fVar1;
                local_80[0][2] = fVar1;
                local_80[0][3] = fVar1;
                local_80[0][4] = fVar1;
                local_80[0][5] = fVar1;
                local_80[0][6] = fVar1;
                local_80[0][7] = fVar1;
              }
              else {
                local_80[0] = *(__m256 *)
                               ((long)(this->super_Padding).per_channel_pad_data.data +
                               local_b8 * 0x20);
              }
              uVar50 = local_ac + (int)local_b8;
              if ((int)uVar50 < 0 || (int)local_108 <= (int)uVar50) {
                iVar36 = top_blob->d * (int)local_c0;
                if (iVar36 < 1) {
                  iVar36 = 0;
                }
                while (bVar57 = iVar36 != 0, iVar36 = iVar36 + -1, bVar57) {
                  *pafVar48 = local_80[0];
                  pafVar48 = pafVar48 + 1;
                }
              }
              else {
                local_a0[0] = (float)(int)uVar54;
                local_a0[1] = (float)(int)(uVar54 >> 0x20);
                local_160.w = bottom_blob->w;
                local_160.h = bottom_blob->h;
                local_160.c = bottom_blob->d;
                pvVar4 = bottom_blob->data;
                uVar54 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                pafVar51 = (__m256 *)(uVar50 * sVar5 * uVar54 + (long)pvVar4);
                local_160.allocator = bottom_blob->allocator;
                local_160.refcount = (int *)0x0;
                local_160.elempack = bottom_blob->elempack;
                local_160.d = 1;
                local_160.dims = bottom_blob->dims + -1;
                local_160.cstep =
                     (uVar54 * (long)local_160.h * (long)local_160.w + 0xf & 0xfffffffffffffff0) /
                     uVar54;
                if (bottom_blob->dims == 4) {
                  local_160.cstep = (long)local_160.h * (long)local_160.w;
                }
                iVar32 = (this->super_Padding).type;
                local_160.data = pafVar51;
                local_160.elemsize = uVar54;
                local_100 = (undefined1  [8])pafVar48;
                if (iVar32 == 0) {
                  padding_constant_pack8_avx
                            (&local_160,(Mat *)local_100,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,local_80);
                  iVar32 = (this->super_Padding).type;
                }
                uVar56 = local_a8;
                if (iVar32 == 1) {
                  iVar32 = (this->super_Padding).left;
                  iVar40 = 0;
                  iVar36 = 0;
                  if (iVar32 < 1) {
                    iVar32 = iVar36;
                  }
                  iVar35 = (this->super_Padding).right;
                  if (iVar35 < 1) {
                    iVar35 = iVar36;
                  }
                  iVar43 = (this->super_Padding).top;
                  if (iVar43 < 1) {
                    iVar43 = iVar36;
                  }
                  iVar36 = (this->super_Padding).bottom;
                  for (; iVar40 != iVar43; iVar40 = iVar40 + 1) {
                    afVar2 = *pafVar51;
                    iVar44 = iVar32;
                    while (bVar57 = iVar44 != 0, iVar44 = iVar44 + -1, bVar57) {
                      *pafVar48 = afVar2;
                      pafVar48 = pafVar48 + 1;
                    }
                    lVar45 = 0;
                    for (iVar44 = 0; iVar44 < local_160.w; iVar44 = iVar44 + 1) {
                      afVar2 = *(__m256 *)((long)pvVar4 + lVar45 + sVar5 * uVar54 * local_a0._0_8_);
                      *(__m256 *)((long)*pafVar48 + lVar45) = afVar2;
                      lVar45 = lVar45 + 0x20;
                    }
                    pafVar48 = (__m256 *)((long)*pafVar48 + lVar45);
                    iVar44 = iVar35;
                    while (bVar57 = iVar44 != 0, iVar44 = iVar44 + -1, bVar57) {
                      *pafVar48 = afVar2;
                      pafVar48 = pafVar48 + 1;
                    }
                  }
                  for (iVar40 = 0; iVar40 < local_160.h; iVar40 = iVar40 + 1) {
                    afVar2 = *pafVar51;
                    iVar43 = iVar32;
                    while (bVar57 = iVar43 != 0, iVar43 = iVar43 + -1, bVar57) {
                      *pafVar48 = afVar2;
                      pafVar48 = pafVar48 + 1;
                    }
                    for (iVar43 = 0; iVar44 = iVar35, iVar43 < local_160.w; iVar43 = iVar43 + 1) {
                      afVar2 = *pafVar51;
                      *pafVar48 = afVar2;
                      pafVar51 = pafVar51 + 1;
                      pafVar48 = pafVar48 + 1;
                    }
                    while (iVar44 != 0) {
                      *pafVar48 = afVar2;
                      pafVar48 = pafVar48 + 1;
                      iVar44 = iVar44 + -1;
                    }
                  }
                  pafVar51 = (__m256 *)((long)pafVar51 + (long)(local_160.w << 3) * -4);
                  iVar40 = 0;
                  if (iVar36 < 1) {
                    iVar36 = iVar40;
                  }
                  for (; iVar40 != iVar36; iVar40 = iVar40 + 1) {
                    afVar2 = *pafVar51;
                    iVar43 = iVar32;
                    while (bVar57 = iVar43 != 0, iVar43 = iVar43 + -1, bVar57) {
                      *pafVar48 = afVar2;
                      pafVar48 = pafVar48 + 1;
                    }
                    lVar45 = 0;
                    for (iVar43 = 0; iVar43 < local_160.w; iVar43 = iVar43 + 1) {
                      afVar2 = *(__m256 *)((long)*pafVar51 + lVar45);
                      *(__m256 *)((long)*pafVar48 + lVar45) = afVar2;
                      lVar45 = lVar45 + 0x20;
                    }
                    pafVar48 = (__m256 *)((long)*pafVar48 + lVar45);
                    iVar43 = iVar35;
                    while (bVar57 = iVar43 != 0, iVar43 = iVar43 + -1, bVar57) {
                      *pafVar48 = afVar2;
                      pafVar48 = pafVar48 + 1;
                    }
                  }
                  iVar32 = (this->super_Padding).type;
                }
                if (iVar32 == 2) {
                  iVar32 = (this->super_Padding).top;
                  uVar50 = (this->super_Padding).left;
                  lVar45 = (long)(int)uVar50;
                  pfVar37 = (float *)local_160.data + local_160.w * iVar32 * 8;
                  uVar33 = 0;
                  uVar54 = 0;
                  if (0 < (int)uVar50) {
                    uVar54 = (ulong)uVar50;
                  }
                  uVar50 = (this->super_Padding).right;
                  uVar42 = (ulong)uVar50;
                  if ((int)uVar50 < 1) {
                    uVar42 = uVar33;
                  }
                  iVar36 = (this->super_Padding).bottom;
                  if (iVar32 < 1) {
                    iVar32 = 0;
                  }
                  lVar39 = uVar54 * 0x20;
                  lVar41 = uVar42 * 0x20;
                  auVar46 = local_100;
                  while( true ) {
                    if ((int)uVar33 == iVar32) break;
                    lVar55 = 0;
                    for (lVar53 = 0; lVar39 + lVar53 != 0; lVar53 = lVar53 + -0x20) {
                      *(undefined1 (*) [32])((long)*(__m256 *)auVar46 + lVar55) =
                           *(undefined1 (*) [32])((long)pfVar37 + lVar53 + lVar45 * 0x20);
                      lVar55 = lVar55 + 0x20;
                    }
                    auVar46 = (undefined1  [8])((long)auVar46 - lVar53);
                    lVar53 = -0x40;
                    pfVar47 = pfVar37;
                    for (iVar40 = 0; iVar40 < local_160.w; iVar40 = iVar40 + 1) {
                      *(__m256 *)auVar46 = *(__m256 *)pfVar47;
                      pfVar47 = pfVar47 + 8;
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x20);
                    }
                    for (; lVar41 + lVar53 != -0x40; lVar53 = lVar53 + -0x20) {
                      *(__m256 *)auVar46 = *(__m256 *)((long)pfVar47 + lVar53);
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x20);
                    }
                    pfVar37 = pfVar37 + (long)local_160.w * -8;
                    uVar33 = (ulong)((int)uVar33 + 1);
                  }
                  for (iVar32 = 0; iVar32 < local_160.h; iVar32 = iVar32 + 1) {
                    lVar55 = 0;
                    for (lVar53 = 0; lVar39 + lVar53 != 0; lVar53 = lVar53 + -0x20) {
                      *(undefined1 (*) [32])((long)*(__m256 *)auVar46 + lVar55) =
                           *(undefined1 (*) [32])((long)pfVar37 + lVar53 + lVar45 * 0x20);
                      lVar55 = lVar55 + 0x20;
                    }
                    auVar46 = (undefined1  [8])((long)auVar46 - lVar53);
                    for (iVar40 = 0; lVar53 = -0x40, iVar40 < local_160.w; iVar40 = iVar40 + 1) {
                      *(__m256 *)auVar46 = *(__m256 *)pfVar37;
                      pfVar37 = pfVar37 + 8;
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x20);
                    }
                    for (; lVar41 + lVar53 != -0x40; lVar53 = lVar53 + -0x20) {
                      *(__m256 *)auVar46 = *(__m256 *)((long)pfVar37 + lVar53);
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x20);
                    }
                  }
                  pfVar37 = pfVar37 + (long)local_160.w * -0x10;
                  iVar32 = 0;
                  if (iVar36 < 1) {
                    iVar36 = iVar32;
                  }
                  for (; iVar32 != iVar36; iVar32 = iVar32 + 1) {
                    lVar55 = 0;
                    for (lVar53 = 0; lVar39 + lVar53 != 0; lVar53 = lVar53 + -0x20) {
                      *(undefined1 (*) [32])((long)*(__m256 *)auVar46 + lVar55) =
                           *(undefined1 (*) [32])((long)pfVar37 + lVar53 + lVar45 * 0x20);
                      lVar55 = lVar55 + 0x20;
                    }
                    auVar46 = (undefined1  [8])((long)auVar46 - lVar53);
                    pfVar47 = pfVar37;
                    for (iVar40 = 0; lVar53 = -0x40, iVar40 < local_160.w; iVar40 = iVar40 + 1) {
                      *(__m256 *)auVar46 = *(__m256 *)pfVar47;
                      pfVar47 = pfVar47 + 8;
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x20);
                    }
                    for (; lVar41 + lVar53 != -0x40; lVar53 = lVar53 + -0x20) {
                      *(__m256 *)auVar46 = *(__m256 *)((long)pfVar47 + lVar53);
                      auVar46 = (undefined1  [8])((long)auVar46 + 0x20);
                    }
                    pfVar37 = pfVar37 + (long)local_160.w * -8;
                  }
                }
                iVar32 = local_a0[0];
                if (local_160.refcount != (int *)0x0) {
                  LOCK();
                  *local_160.refcount = *local_160.refcount + -1;
                  UNLOCK();
                  if (*local_160.refcount == 0) {
                    if (local_160.allocator == (Allocator *)0x0) {
                      free(local_160.data);
                    }
                    else {
                      (*(local_160.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (uStack_f8 != (int *)0x0) {
                  LOCK();
                  *uStack_f8 = *uStack_f8 + -1;
                  UNLOCK();
                  if (*uStack_f8 == 0) {
                    if (local_e0 == (Allocator *)0x0) {
                      free((void *)local_100);
                    }
                    else {
                      (*local_e0->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              uVar54 = (ulong)(iVar32 + 1);
            }
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        if ((this->super_Padding).type == 0) {
          uVar50 = uVar50 + iVar32 + auVar59._8_4_;
          auVar6 = vpaddd_avx(auVar6,auVar60);
          auVar6 = vpaddd_avx(auVar6,auVar58);
          auVar60 = vpaddd_avx(auVar7,auVar59);
          auVar60 = vpaddd_avx(auVar60,auVar8);
          Mat::create(top_blob,auVar60._0_4_,auVar6._0_4_,uVar50,auVar59._12_4_,uStack_f0,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar50 < 1) {
              uVar50 = 0;
            }
            if ((int)auVar59._12_4_ < 1) {
              uVar54 = 0;
            }
            local_108 = uVar54;
            for (uVar56 = 0; uVar56 != local_108; uVar56 = uVar56 + 1) {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar1 = (this->super_Padding).value;
                local_a0[1] = fVar1;
                local_a0[0] = fVar1;
                local_a0[2] = fVar1;
                local_a0[3] = fVar1;
                local_a0[4] = fVar1;
                local_a0[5] = fVar1;
                local_a0[6] = fVar1;
                local_a0[7] = fVar1;
              }
              else {
                local_a0 = *(__m256 *)
                            ((long)(this->super_Padding).per_channel_pad_data.data + uVar56 * 0x20);
              }
              auVar61 = ZEXT3264((undefined1  [32])local_a0);
              local_80[0] = local_a0;
              for (uVar54 = 0; uVar54 != uVar50; uVar54 = uVar54 + 1) {
                uVar28 = top_blob->w;
                uVar29 = top_blob->h;
                local_d4._4_4_ = uVar29;
                local_d4._0_4_ = uVar28;
                uStack_f0 = top_blob->elemsize;
                fStack_e8 = (float)top_blob->elempack;
                local_c0 = (long)top_blob->h * (long)top_blob->w;
                local_100 = (undefined1  [8])
                            ((long)top_blob->data +
                            uVar54 * uStack_f0 * local_c0 + top_blob->cstep * uVar56 * uStack_f0);
                local_e0 = top_blob->allocator;
                uStack_f8 = (int *)0x0;
                local_d8 = 2;
                local_d4._8_8_ = 0x100000001;
                uVar38 = (int)uVar54 - (this->super_Padding).front;
                if ((int)uVar38 < 0 || (int)auVar59._8_4_ <= (int)uVar38) {
                  uVar33 = local_c0 & 0xffffffff;
                  if ((int)local_c0 < 1) {
                    uVar33 = 0;
                  }
                  while (iVar32 = (int)uVar33, uVar33 = (ulong)(iVar32 - 1), iVar32 != 0) {
                    *(undefined1 (*) [32])local_100 = auVar61._0_32_;
                    local_100 = (undefined1  [8])((long)local_100 + 0x20);
                  }
                }
                else {
                  local_160.h = bottom_blob->h;
                  local_160.elemsize = bottom_blob->elemsize;
                  local_160.allocator = bottom_blob->allocator;
                  local_160.cstep = (long)local_160.h * (long)bottom_blob->w;
                  local_160.data =
                       (void *)((long)bottom_blob->data +
                               uVar38 * local_160.elemsize * local_160.cstep +
                               bottom_blob->cstep * uVar56 * local_160.elemsize);
                  local_160.refcount = (int *)0x0;
                  local_160.elempack = bottom_blob->elempack;
                  local_160.w = bottom_blob->w;
                  local_160.dims = 2;
                  local_160.d = 1;
                  local_160.c = 1;
                  padding_constant_pack8_avx
                            (&local_160,(Mat *)local_100,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right,local_80);
                  auVar61 = ZEXT3264((undefined1  [32])local_a0);
                }
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003c0f17;
      }
    }
  }
  piVar3 = bottom_blob->refcount;
  local_100 = (undefined1  [8])bottom_blob->data;
  uStack_f8 = bottom_blob->refcount;
  local_e0 = bottom_blob->allocator;
  local_c0 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  local_d4 = auVar59;
  if (fStack_e8 != 1.4013e-45) {
    local_160.data = *(void **)opt;
    local_160.elemsize = (size_t)opt->workspace_allocator;
    local_160.elempack = opt->openmp_blocktime;
    local_160._28_1_ = opt->use_winograd_convolution;
    local_160._29_1_ = opt->use_sgemm_convolution;
    local_160._30_1_ = opt->use_int8_inference;
    local_160._31_1_ = opt->use_vulkan_compute;
    local_160.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_160._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    uVar9 = opt->flush_denormals;
    uVar10 = opt->use_local_pool_allocator;
    uVar12 = opt->use_shader_local_memory;
    uVar14 = opt->use_cooperative_matrix;
    uVar16 = opt->use_winograd23_convolution;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    uVar17._0_1_ = opt->use_winograd43_convolution;
    uVar17._1_1_ = opt->use_winograd63_convolution;
    uVar17._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar17._3_1_ = opt->use_fp16_uniform;
    uVar18 = opt->use_int8_uniform;
    uVar19 = opt->use_reserved_9;
    uVar21 = opt->use_reserved_10;
    uVar23 = opt->use_reserved_11;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar17._4_4_ = CONCAT31(uVar20,uVar18);
    local_160.c = (int)uVar17;
    local_160.refcount = (int *)opt->workspace_allocator;
    local_160.h = uVar9;
    local_160.d = uVar11;
    local_160._60_4_ = uVar17._4_4_;
    convert_packing(bottom_blob,(Mat *)local_100,1,(Option *)&local_160);
    if ((local_100 == (undefined1  [8])0x0) || ((long)(int)local_d4._12_4_ * local_c0 == 0)) {
      iVar32 = -100;
      goto LAB_003c0ff9;
    }
  }
  iVar32 = Padding::forward(&this->super_Padding,(Mat *)local_100,top_blob,opt);
LAB_003c0ff9:
  if (uStack_f8 != (int *)0x0) {
    LOCK();
    *uStack_f8 = *uStack_f8 + -1;
    UNLOCK();
    if (*uStack_f8 == 0) {
      if (local_e0 == (Allocator *)0x0) {
        free((void *)local_100);
      }
      else {
        (*local_e0->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int Padding_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}